

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator iVar1;
  pair<int,_int> pVar2;
  sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  pointer ppVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  pair<const_std::pair<int,_int>,_int> pVar5;
  size_type expected_bucknum;
  AssertionResult gtest_ar;
  pair<int,_int> local_88;
  pair<const_std::pair<int,_int>,_int> local_80;
  size_type local_70;
  pair<google::sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_68;
  
  pVar5 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(1);
  local_68.first.ht =
       (sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)pVar5.first;
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  pVar4 = google::
          sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_68);
  local_70 = pVar4.second;
  if (pVar4.first != 0xffffffffffffffff) {
    local_70 = pVar4.first;
  }
  local_88 = (pair<int,_int>)((ulong)(uint)local_88.second << 0x20);
  pVar2 = (pair<int,_int>)
          google::
          sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::bucket_size(&this_00->rep,local_70);
  local_80.first = pVar2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_68,"0u","this->ht_.bucket_size(expected_bucknum)",(uint *)&local_88,
             (unsigned_long *)&local_80);
  if ((char)local_68.first.ht == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_68.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x254,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_80.first != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_80.first + 8))();
    }
  }
  iVar1._M_current = local_68.first.pos.row_begin._M_current;
  if (local_68.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_68.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_68.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_68.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_80 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(1);
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_68,&this_00->rep,&local_80);
  pVar5 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(1);
  local_88 = pVar5.first;
  pVar4 = google::
          sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,&local_88);
  pVar2 = (pair<int,_int>)pVar4.second;
  if ((pair<int,_int>)pVar4.first != (pair<int,_int>)0xffffffffffffffff) {
    pVar2 = (pair<int,_int>)pVar4.first;
  }
  local_80.first = pVar2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_68,"expected_bucknum","this->ht_.bucket(this->UniqueKey(1))",
             &local_70,(unsigned_long *)&local_80);
  if ((char)local_68.first.ht == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_68.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,599,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_80.first != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_80.first + 8))();
    }
  }
  iVar1._M_current = local_68.first.pos.row_begin._M_current;
  if (local_68.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_68.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_68.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_68.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_88.first = 1;
  pVar2 = (pair<int,_int>)
          google::
          sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::bucket_size(&this_00->rep,local_70);
  local_80.first = pVar2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_68,"1u","this->ht_.bucket_size(expected_bucknum)",(uint *)&local_88,
             (unsigned_long *)&local_80);
  if ((char)local_68.first.ht == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_68.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,600,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_80.first != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_80.first + 8))();
    }
  }
  iVar1._M_current = local_68.first.pos.row_begin._M_current;
  if (local_68.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_68.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_68.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_68.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_88 = (pair<int,_int>)((ulong)local_88 & 0xffffffff00000000);
  pVar2 = (pair<int,_int>)
          google::
          sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::bucket_size(&this_00->rep,local_70 ^ 1);
  local_80.first = pVar2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_68,"0u","this->ht_.bucket_size(expected_bucknum ^ 1)",
             (uint *)&local_88,(unsigned_long *)&local_80);
  if ((char)local_68.first.ht == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_68.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x25c,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_80.first != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_80.first + 8))();
    }
  }
  if (local_68.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_68.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_68.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_68.first.pos.row_begin._M_current)->group);
    }
    operator_delete(local_68.first.pos.row_begin._M_current);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketAndBucketSize) {
  const typename TypeParam::size_type expected_bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum));

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(expected_bucknum, this->ht_.bucket(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.bucket_size(expected_bucknum));

  // Check that a bucket we didn't insert into, has a 0 size.  Since
  // we have an even number of buckets, bucknum^1 is guaranteed in range.
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum ^ 1));
}